

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O3

void cali::util::
     tokenize<std::__cxx11::string,char,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input,
               char *tokens,
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               out)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  value_type local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if (input->_M_string_length != 0) {
    pcVar3 = (input->_M_dataplus)._M_p;
    pcVar5 = pcVar3 + input->_M_string_length;
    do {
      cVar2 = *tokens;
      pcVar1 = tokens + 1;
      while (cVar4 = (char)&local_50, cVar2 != '\0') {
        if (*pcVar3 == cVar2) {
          if (local_50._M_string_length != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(out.container,&local_50);
          }
          local_50._M_string_length = 0;
          *local_50._M_dataplus._M_p = '\0';
          std::__cxx11::string::push_back(cVar4);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(out.container,&local_50);
          local_50._M_string_length = 0;
          *local_50._M_dataplus._M_p = '\0';
          goto LAB_0018e93b;
        }
        cVar2 = *pcVar1;
        pcVar1 = pcVar1 + 1;
      }
      std::__cxx11::string::push_back(cVar4);
LAB_0018e93b:
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 != pcVar5);
    if (local_50._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(out.container,&local_50);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void tokenize(String input, const Char* tokens, OutputIterator out)
{
    String str;

    for (Char c : input) {
        bool is_token_char = false;
        for (const Char* tc = tokens; *tc; ++tc)
            if (c == *tc) {
                is_token_char = true;
                break;
            }

        if (is_token_char) {
            if (!str.empty())
                *out++ = str;
            str.clear();

            str.push_back(c);
            *out++ = str;
            str.clear();
        } else {
            str.push_back(c);
        }
    }

    if (!str.empty())
        *out++ = str;
}